

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

void ps_builder_init(PS_Builder *ps_builder,void *builder,FT_Bool is_t1)

{
  FT_Bool FVar1;
  FT_Bool FVar2;
  FT_Bool FVar3;
  FT_Bool FVar4;
  long lVar5;
  undefined3 in_register_00000011;
  long lVar6;
  long lVar7;
  
  (ps_builder->funcs).init = (_func_void_PS_Builder_ptr_void_ptr_FT_Bool *)0x0;
  (ps_builder->funcs).done = (_func_void_PS_Builder_ptr *)0x0;
  ps_builder->bbox = (FT_BBox *)0x0;
  ps_builder->path_begun = '\0';
  ps_builder->load_points = '\0';
  ps_builder->no_recurse = '\0';
  ps_builder->metrics_only = '\0';
  ps_builder->is_t1 = '\0';
  *(undefined3 *)&ps_builder->field_0x5d = 0;
  ps_builder->left_bearing = (FT_Vector *)0x0;
  ps_builder->advance = (FT_Vector *)0x0;
  ps_builder->pos_x = (FT_Pos *)0x0;
  ps_builder->pos_y = (FT_Pos *)0x0;
  ps_builder->base = (FT_Outline *)0x0;
  ps_builder->current = (FT_Outline *)0x0;
  ps_builder->glyph = (CFF_GlyphSlot)0x0;
  ps_builder->loader = (FT_GlyphLoader)0x0;
  ps_builder->memory = (FT_Memory)0x0;
  ps_builder->face = (FT_Face)0x0;
  ps_builder->memory = *builder;
  ps_builder->face = *(FT_Face *)((long)builder + 8);
  ps_builder->glyph = *(CFF_GlyphSlot *)((long)builder + 0x10);
  ps_builder->loader = *(FT_GlyphLoader *)((long)builder + 0x18);
  ps_builder->base = *(FT_Outline **)((long)builder + 0x20);
  ps_builder->current = *(FT_Outline **)((long)builder + 0x28);
  ps_builder->pos_x = (FT_Pos *)((long)builder + 0x30);
  ps_builder->pos_y = (FT_Pos *)((long)builder + 0x38);
  ps_builder->left_bearing = (FT_Vector *)((long)builder + 0x40);
  ps_builder->advance = (FT_Vector *)((long)builder + 0x50);
  ps_builder->bbox = (FT_BBox *)((long)builder + 0x60);
  if (CONCAT31(in_register_00000011,is_t1) == 0) {
    FVar4 = *(FT_Bool *)((long)builder + 0x80);
    lVar5 = 0x83;
    lVar6 = 0x82;
    lVar7 = 0x81;
  }
  else {
    FVar4 = '\0';
    lVar5 = 0x86;
    lVar6 = 0x85;
    lVar7 = 0x84;
  }
  FVar1 = *(FT_Bool *)((long)builder + lVar5);
  FVar2 = *(FT_Bool *)((long)builder + lVar6);
  FVar3 = *(FT_Bool *)((long)builder + lVar7);
  ps_builder->path_begun = FVar4;
  ps_builder->load_points = FVar3;
  ps_builder->no_recurse = FVar2;
  ps_builder->metrics_only = FVar1;
  ps_builder->is_t1 = is_t1;
  ps_builder->funcs = ps_builder_funcs;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_builder_init( PS_Builder*  ps_builder,
                   void*        builder,
                   FT_Bool      is_t1 )
  {
    FT_ZERO( ps_builder );

    if ( is_t1 )
    {
      T1_Builder  t1builder = (T1_Builder)builder;


      ps_builder->memory  = t1builder->memory;
      ps_builder->face    = (FT_Face)t1builder->face;
      ps_builder->glyph   = (CFF_GlyphSlot)t1builder->glyph;
      ps_builder->loader  = t1builder->loader;
      ps_builder->base    = t1builder->base;
      ps_builder->current = t1builder->current;

      ps_builder->pos_x = &t1builder->pos_x;
      ps_builder->pos_y = &t1builder->pos_y;

      ps_builder->left_bearing = &t1builder->left_bearing;
      ps_builder->advance      = &t1builder->advance;

      ps_builder->bbox        = &t1builder->bbox;
      ps_builder->path_begun  = 0;
      ps_builder->load_points = t1builder->load_points;
      ps_builder->no_recurse  = t1builder->no_recurse;

      ps_builder->metrics_only = t1builder->metrics_only;
    }
    else
    {
      CFF_Builder*  cffbuilder = (CFF_Builder*)builder;


      ps_builder->memory  = cffbuilder->memory;
      ps_builder->face    = (FT_Face)cffbuilder->face;
      ps_builder->glyph   = cffbuilder->glyph;
      ps_builder->loader  = cffbuilder->loader;
      ps_builder->base    = cffbuilder->base;
      ps_builder->current = cffbuilder->current;

      ps_builder->pos_x = &cffbuilder->pos_x;
      ps_builder->pos_y = &cffbuilder->pos_y;

      ps_builder->left_bearing = &cffbuilder->left_bearing;
      ps_builder->advance      = &cffbuilder->advance;

      ps_builder->bbox        = &cffbuilder->bbox;
      ps_builder->path_begun  = cffbuilder->path_begun;
      ps_builder->load_points = cffbuilder->load_points;
      ps_builder->no_recurse  = cffbuilder->no_recurse;

      ps_builder->metrics_only = cffbuilder->metrics_only;
    }

    ps_builder->is_t1 = is_t1;
    ps_builder->funcs = ps_builder_funcs;
  }